

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_ringbuffer.c
# Opt level: O2

ring_buffer_size_t
PaUtil_GetRingBufferWriteRegions
          (PaUtilRingBuffer *rbuf,ring_buffer_size_t elementCount,void **dataPtr1,
          ring_buffer_size_t *sizePtr1,void **dataPtr2,ring_buffer_size_t *sizePtr2)

{
  long lVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = rbuf->bufferSize;
  lVar1 = lVar4 - (rbuf->writeIndex - rbuf->readIndex & rbuf->bigMask);
  if (elementCount <= lVar1) {
    lVar1 = elementCount;
  }
  uVar3 = rbuf->smallMask & rbuf->writeIndex;
  if (lVar4 < (long)(uVar3 + lVar1)) {
    *dataPtr1 = rbuf->buffer + uVar3 * rbuf->elementSizeBytes;
    pcVar2 = rbuf->buffer;
    lVar5 = lVar1 - (lVar4 - uVar3);
    lVar4 = lVar4 - uVar3;
  }
  else {
    *dataPtr1 = rbuf->buffer + uVar3 * rbuf->elementSizeBytes;
    pcVar2 = (char *)0x0;
    lVar5 = 0;
    lVar4 = lVar1;
  }
  *sizePtr1 = lVar4;
  *dataPtr2 = pcVar2;
  *sizePtr2 = lVar5;
  return lVar1;
}

Assistant:

ring_buffer_size_t PaUtil_GetRingBufferWriteRegions( PaUtilRingBuffer *rbuf, ring_buffer_size_t elementCount,
                                       void **dataPtr1, ring_buffer_size_t *sizePtr1,
                                       void **dataPtr2, ring_buffer_size_t *sizePtr2 )
{
    ring_buffer_size_t   index;
    ring_buffer_size_t   available = PaUtil_GetRingBufferWriteAvailable( rbuf );
    if( elementCount > available ) elementCount = available;
    /* Check to see if write is not contiguous. */
    index = rbuf->writeIndex & rbuf->smallMask;
    if( (index + elementCount) > rbuf->bufferSize )
    {
        /* Write data in two blocks that wrap the buffer. */
        ring_buffer_size_t   firstHalf = rbuf->bufferSize - index;
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = firstHalf;
        *dataPtr2 = &rbuf->buffer[0];
        *sizePtr2 = elementCount - firstHalf;
    }
    else
    {
        *dataPtr1 = &rbuf->buffer[index*rbuf->elementSizeBytes];
        *sizePtr1 = elementCount;
        *dataPtr2 = NULL;
        *sizePtr2 = 0;
    }

    if( available )
        PaUtil_FullMemoryBarrier(); /* (write-after-read) => full barrier */

    return elementCount;
}